

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  undefined4 uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ostream *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  mapped_type *this;
  size_t *psVar6;
  undefined4 *puVar7;
  int i;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 *puVar10;
  Employee *item;
  long *plVar11;
  pointer __x;
  pointer pEVar12;
  uint uVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  initializer_list<Employee> __l;
  initializer_list<float> __l_00;
  int age_thresh;
  string __str;
  string __str_1;
  vector<Employee,_std::allocator<Employee>_> employees;
  vector<Employee,_std::allocator<Employee>_> age_gt_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  grouped_transformed;
  undefined4 local_224;
  undefined1 local_220 [8];
  undefined8 uStack_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  key_type local_1b0;
  vector<Employee,_std::allocator<Employee>_> local_190;
  undefined1 local_178 [8];
  undefined8 local_170;
  pointer pEStack_168;
  _Base_ptr local_160;
  _Base_ptr p_Stack_158;
  size_t local_150;
  value_type *local_148;
  vector<Employee,_std::allocator<Employee>_> local_140;
  undefined1 local_128 [32];
  _Base_ptr local_108;
  size_t sStack_100;
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined4 local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined4 local_a0;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined4 local_70;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined4 local_40;
  
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"Fatih","");
  local_108 = (_Base_ptr)0x2300000001;
  sStack_100 = CONCAT44(sStack_100._4_4_,8500.0);
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Elif","");
  local_d8 = 0x1c00000000;
  local_d0 = 0x45c67000;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Erkin","");
  local_a8 = 0x2b00000001;
  local_a0 = 0x46147000;
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Mehmet","");
  local_78 = 0x2e00000001;
  local_70 = 0x46241000;
  plVar11 = local_58;
  local_68[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"Melis","");
  local_48 = 0x3000000000;
  local_40 = 0x46435000;
  __l._M_len = 5;
  __l._M_array = (iterator)local_128;
  std::vector<Employee,_std::allocator<Employee>_>::vector
            (&local_190,__l,(allocator_type *)local_178);
  lVar16 = -0xf0;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -6;
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"First Employee:",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  s = (ostream *)std::ostream::flush();
  operator<<(s,local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
               super__Vector_impl_data._M_start);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + (char)s);
  std::ostream::put((char)s);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All Employees:",0xe);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  print<std::vector<Employee,_std::allocator<Employee>_>_>(&local_190);
  local_224 = 0x28;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Employees older than 40 years old:",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  filter<std::vector<Employee,std::allocator<Employee>>,main::__0>
            (&local_140,&local_190,(anon_class_8_1_3dfc913a)&local_224);
  print<std::vector<Employee,_std::allocator<Employee>_>_>(&local_140);
  local_224 = 0x2d;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Employees older than 45 years old (again in functional composition):",0x44);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  filter<std::vector<Employee,std::allocator<Employee>>,main::__0>
            ((vector<Employee,_std::allocator<Employee>_> *)local_128,&local_190,
             (anon_class_8_1_3dfc913a)&local_224);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)local_128);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)local_128);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Female employees who take less salary than 9000TL:",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  pEVar12 = local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ = 0;
  if (local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
          super__Vector_impl_data._M_start;
    do {
      if ((__x->salary <= 9000.0 && __x->salary != 9000.0) && (__x->gender == Female)) {
        std::vector<Employee,_std::allocator<Employee>_>::push_back
                  ((vector<Employee,_std::allocator<Employee>_> *)local_128,__x);
      }
      __x = __x + 1;
    } while (__x != pEVar12);
  }
  local_178 = (undefined1  [8])local_128._0_8_;
  local_170 = (pointer)local_128._8_8_;
  pEStack_168 = (pointer)local_128._16_8_;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  local_128._16_8_ = 0;
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)local_128);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)local_178);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)local_178);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Employees grouped by age ranges of 10 year increments:",0x36);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  local_128._24_8_ = local_128 + 8;
  local_128._16_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128._8_8_ = (pointer)0x0;
  sStack_100 = 0;
  local_148 = local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_108 = (_Base_ptr)local_128._24_8_;
  if (local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pEVar12 = local_190.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      iVar2 = pEVar12->age / 10;
      uVar15 = iVar2 * 10;
      uVar17 = iVar2 * -10;
      if ((int)uVar17 < 0) {
        uVar17 = uVar15;
      }
      uVar13 = 1;
      if (9 < uVar17) {
        uVar8 = (ulong)uVar17;
        uVar3 = 4;
        do {
          uVar13 = uVar3;
          uVar4 = (uint)uVar8;
          if (uVar4 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_001049ba;
          }
          if (uVar4 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_001049ba;
          }
          if (uVar4 < 10000) goto LAB_001049ba;
          uVar8 = uVar8 / 10000;
          uVar3 = uVar13 + 4;
        } while (99999 < uVar4);
        uVar13 = uVar13 + 1;
      }
LAB_001049ba:
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_1f0,(ulong)(-((int)uVar15 >> 0x1f) + uVar13),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_1f0._M_dataplus._M_p + (uint)-((int)uVar15 >> 0x1f),uVar13,uVar17);
      pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1f0,"..");
      local_220 = (undefined1  [8])(pbVar5->_M_dataplus)._M_p;
      paVar9 = &pbVar5->field_2;
      if (local_220 == (undefined1  [8])paVar9) {
        local_210[0]._0_8_ = paVar9->_M_allocated_capacity;
        local_210[0]._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_220 = (undefined1  [8])local_210;
      }
      else {
        local_210[0]._0_8_ = paVar9->_M_allocated_capacity;
      }
      uStack_218 = (pointer)pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar5->_M_string_length = 0;
      (pbVar5->field_2)._M_local_buf[0] = '\0';
      uVar15 = uVar15 + 9;
      uVar17 = -uVar15;
      if (0 < (int)uVar15) {
        uVar17 = uVar15;
      }
      uVar13 = 1;
      if (9 < uVar17) {
        uVar8 = (ulong)uVar17;
        uVar3 = 4;
        do {
          uVar13 = uVar3;
          uVar4 = (uint)uVar8;
          if (uVar4 < 100) {
            uVar13 = uVar13 - 2;
            goto LAB_00104aa3;
          }
          if (uVar4 < 1000) {
            uVar13 = uVar13 - 1;
            goto LAB_00104aa3;
          }
          if (uVar4 < 10000) goto LAB_00104aa3;
          uVar8 = uVar8 / 10000;
          uVar3 = uVar13 + 4;
        } while (99999 < uVar4);
        uVar13 = uVar13 + 1;
      }
LAB_00104aa3:
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&local_1d0,(ulong)(-((int)uVar15 >> 0x1f) + uVar13),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_1d0._M_dataplus._M_p + (uint)-((int)uVar15 >> 0x1f),uVar13,uVar17);
      uVar14 = 0xf;
      if (local_220 != (undefined1  [8])local_210) {
        uVar14 = local_210[0]._M_allocated_capacity;
      }
      if ((ulong)uVar14 < local_1d0._M_string_length + (long)uStack_218) {
        uVar14 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          uVar14 = local_1d0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar14 < local_1d0._M_string_length + (long)uStack_218) goto LAB_00104b20;
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 replace(&local_1d0,0,0,(char *)local_220,(size_type)uStack_218);
      }
      else {
LAB_00104b20:
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_220,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
      }
      local_1b0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
      paVar9 = &pbVar5->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p == paVar9) {
        local_1b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_1b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
      }
      else {
        local_1b0.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
      }
      local_1b0._M_string_length = pbVar5->_M_string_length;
      (pbVar5->_M_dataplus)._M_p = (pointer)paVar9;
      pbVar5->_M_string_length = 0;
      paVar9->_M_local_buf[0] = '\0';
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if (local_220 != (undefined1  [8])local_210) {
        operator_delete((void *)local_220,local_210[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      this = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
                           *)local_128,&local_1b0);
      std::vector<Employee,_std::allocator<Employee>_>::push_back(this,pEVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      pEVar12 = pEVar12 + 1;
    } while (pEVar12 != local_148);
  }
  puVar10 = &local_170;
  if (local_128._16_8_ == 0) {
    psVar6 = &local_150;
    local_170 = (pointer)((ulong)local_170._4_4_ << 0x20);
    pEStack_168 = (pointer)0x0;
  }
  else {
    psVar6 = &sStack_100;
    local_170 = (pointer)CONCAT44(local_170._4_4_,local_128._8_4_);
    pEStack_168 = (pointer)local_128._16_8_;
    local_160 = (_Base_ptr)local_128._24_8_;
    p_Stack_158 = local_108;
    *(undefined8 **)(local_128._16_8_ + 8) = puVar10;
    local_150 = sStack_100;
    local_128._16_8_ = 0;
    puVar10 = (undefined8 *)(local_128 + 8);
  }
  psVar6[-2] = (size_t)puVar10;
  psVar6[-1] = (size_t)puVar10;
  *psVar6 = 0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
               *)local_128);
  print<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
              *)local_178);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Number of employees available in age ranges of 10 year increments:",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (local_128,local_178);
  print<std::__cxx11::string,unsigned_long>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)local_128);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Number of employees available in age ranges of 10 year increments (again):",0x4a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x48);
  std::ostream::put(-0x48);
  std::ostream::flush();
  transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (local_220,local_178);
  print<std::__cxx11::string,unsigned_long>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)local_220);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_220);
  local_220 = (undefined1  [8])0x140000000a;
  uStack_218 = (pointer)CONCAT44(uStack_218._4_4_,0x1e);
  lVar16 = 0;
  do {
    *(int *)(local_220 + lVar16) = *(int *)(local_220 + lVar16) * *(int *)(local_220 + lVar16);
    lVar16 = lVar16 + 4;
  } while (lVar16 != 0xc);
  local_1f0._M_dataplus._M_p = (pointer)local_220;
  local_1f0._M_string_length = CONCAT44(local_1f0._M_string_length._4_4_,(_Rb_tree_color)uStack_218)
  ;
  print<std::array<int,_3UL>_>((array<int,_3UL> *)&local_1f0);
  puVar7 = (undefined4 *)((long)&uStack_218 + 4);
  local_220 = (undefined1  [8])0x400ccccd3f8ccccd;
  uStack_218 = (pointer)0x408ccccd40533333;
  lVar16 = 0;
  do {
    uVar1 = *(undefined4 *)(local_220 + lVar16 * 4);
    *(undefined4 *)(local_220 + lVar16 * 4) = *puVar7;
    *puVar7 = uVar1;
    lVar16 = lVar16 + 1;
    puVar7 = puVar7 + -1;
  } while (lVar16 == 1);
  local_1f0._M_dataplus._M_p = (pointer)local_220;
  local_1f0._M_string_length = 0x408ccccd40533333;
  print<std::array<float,_4UL>_>((array<float,_4UL> *)&local_1f0);
  local_1d0._M_dataplus._M_p = (pointer)0x400ccccd3f8ccccd;
  local_1d0._M_string_length = 0x408ccccd40533333;
  __l_00._M_len = 4;
  __l_00._M_array = (iterator)&local_1d0;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&local_1f0,__l_00,(allocator_type *)&local_1b0
            );
  reverse<std::vector<float,std::allocator<float>>>
            ((vector<float,_std::allocator<float>_> *)local_220,
             (vector<float,_std::allocator<float>_> *)&local_1f0);
  print<std::vector<float,_std::allocator<float>_>_>
            ((vector<float,_std::allocator<float>_> *)local_220);
  if (local_220 != (undefined1  [8])0x0) {
    operator_delete((void *)local_220,local_210[0]._M_allocated_capacity - (long)local_220);
  }
  if (local_1f0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_1f0._M_dataplus._M_p,
                    local_1f0.field_2._M_allocated_capacity - (long)local_1f0._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               *)local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
               *)local_178);
  std::vector<Employee,_std::allocator<Employee>_>::~vector(&local_140);
  std::vector<Employee,_std::allocator<Employee>_>::~vector(&local_190);
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto employees = std::vector<Employee>{
        {"Fatih", Male, 35, 8500},
        {"Elif", Female, 28, 6350},
        {"Erkin", Male, 43, 9500},
        {"Mehmet", Male, 46, 10500},
        {"Melis", Female, 48, 12500},
        };

    // Q1) (5pts) Make employee directly sendable to the console
    std::cout << "First Employee:" << std::endl << employees[0] << std::endl;
    // Fatih, Male, 35, 8500TL

    // Q2) (5pts) Create a print overload that can print "employees" variable
    std::cout << "All Employees:" << std::endl;
    print(employees);
    // [Fatih, Male, 35, 8500TL]; [Elif, Female, 28, 6350TL]; [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    auto age_thresh = 40;

    // Q3) (5pts) Create a filter overload that can work with any kind of containers. Make it work with "employees"
    std::cout << "Employees older than 40 years old:" << std::endl;
    auto lambda_filter = [&age_thresh](const Employee& e) { return e.age > age_thresh; };
    auto age_gt_40 = filter(employees, lambda_filter);
    print(age_gt_40);
    // [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q4a) (5pts) Apply filter to a container by & operator
    // Q4b) (5pts) Send container to console by piping it to PRINT with | operator.
    age_thresh = 45;
    std::cout << "Employees older than 45 years old (again in functional composition):" << std::endl;
    employees & lambda_filter | PRINT;
    // [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q5) (5pts) Make below code work.
    std::cout << "Female employees who take less salary than 9000TL:" << std::endl;
    print(filter(employees, [](const Employee& e) { return e.salary < 9000 && e.gender == Female; }));
    // [Elif, Female, 28, 6350TL]

    // Q6a) (15pts) Create a group_by algorithm that can group elements of a container by a specific criterion
    // Q6b) (5pts) Group employees by age ranges of 10 year increments by filling in lambda_group below
    // Q6c) (5pts) Make the grouped result printable via print(grouped) as below
    std::cout << "Employees grouped by age ranges of 10 year increments:" << std::endl;
    auto lambda_group = [](const Employee& e) {
        auto a = e.age/10*10; // note: division of integer truncates the result.
        auto b = a+9;
        return std::to_string(a) + ".." + std::to_string(b);
    };
    auto grouped = group_by(employees, lambda_group);
    print(grouped);
    // <20..29>: [Elif, Female, 28, 6350TL]
    // <30..39>: [Fatih, Male, 35, 8500TL]
    // <40..49>: [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q7a) (10pts) Create a transform algorithm that can work on "grouped" variable.
    // Q7b) (5pts) Write necessary transformation lambda for aggregating each group's element count.
    // Q7c) (5pts) Make the grouped and transformed result printable via print(grouped_transformed) as below
    std::cout << "Number of employees available in age ranges of 10 year increments:" << std::endl;
    auto lambda_transform = [](const auto& pair) {
        using Key = typename remove_const<decltype(pair.first)>::type;
        using Value = size_t;
        return std::pair<Key, Value>{pair.first, pair.second.size()};
    };
    auto grouped_transformed = transform(grouped, lambda_transform);
    print(grouped_transformed);
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q8) (10pts) Make the below code work as the same as Q7's code block
    std::cout << "Number of employees available in age ranges of 10 year increments (again):" << std::endl;
    grouped | lambda_transform | PRINT;
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q9) (5pts) Make below line work
    std::array<int, 3>{10, 20, 30} | [](int a) { return a*a; } | PRINT;
    // [100]; [400]; [900]

    // Q10) Overload "operator-" to get the reverse of passed container
    // Q10a) (5pts) Make it work with array containers with the result pipable to PRINT as below
    // Q10b) (5pts) Make it work with other containers with the result pipable to PRINT as below
    -std::array<float, 4>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]
    -std::vector<float>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]

    return 0;
}